

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deformableconv2d.cpp
# Opt level: O0

int __thiscall ncnn::DeformableConv2D::load_model(DeformableConv2D *this,ModelBin *mb)

{
  int *piVar1;
  void **ppvVar2;
  long *in_RSI;
  long in_RDI;
  bool bVar3;
  void *local_1c8;
  int *local_1c0;
  long *local_1a8;
  void *local_170;
  int *local_168;
  undefined8 local_160;
  undefined4 local_158;
  long *local_150;
  undefined4 local_148;
  undefined4 local_144;
  undefined4 local_140;
  undefined4 local_13c;
  undefined4 local_138;
  undefined8 local_130;
  long *local_128;
  int local_114;
  void **local_110;
  void **local_100;
  int local_f0;
  undefined4 local_ec;
  void **local_e8;
  void **local_e0;
  void **local_d8;
  int local_d0;
  undefined4 local_cc;
  void **local_c8;
  void **local_c0;
  void **local_b8;
  long *local_a8;
  int local_a0;
  undefined4 local_9c;
  void **local_98;
  int local_90;
  undefined4 local_8c;
  void **local_88;
  int local_70;
  undefined4 local_6c;
  void **local_68;
  int local_50;
  undefined4 local_4c;
  void **local_48;
  void *local_20;
  void *local_18;
  long *local_10;
  
  local_128 = in_RSI;
  (**(code **)(*in_RSI + 0x10))(&local_170,in_RSI,*(undefined4 *)(in_RDI + 0x100),0);
  ppvVar2 = (void **)(in_RDI + 0x150);
  local_c8 = &local_170;
  local_c0 = ppvVar2;
  if (ppvVar2 != local_c8) {
    if (local_168 != (int *)0x0) {
      local_cc = 1;
      LOCK();
      local_d0 = *local_168;
      *local_168 = *local_168 + 1;
      UNLOCK();
    }
    local_98 = ppvVar2;
    if (*(long *)(in_RDI + 0x158) != 0) {
      piVar1 = *(int **)(in_RDI + 0x158);
      local_9c = 0xffffffff;
      LOCK();
      local_a0 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (local_a0 == 1) {
        if (*(long *)(in_RDI + 0x170) == 0) {
          local_18 = *ppvVar2;
          if (local_18 != (void *)0x0) {
            free(local_18);
          }
        }
        else {
          (**(code **)(**(long **)(in_RDI + 0x170) + 0x18))(*(long **)(in_RDI + 0x170),*ppvVar2);
        }
      }
    }
    *ppvVar2 = (void *)0x0;
    *(undefined8 *)(in_RDI + 0x160) = 0;
    *(undefined4 *)(in_RDI + 0x168) = 0;
    *(undefined4 *)(in_RDI + 0x178) = 0;
    *(undefined4 *)(in_RDI + 0x17c) = 0;
    *(undefined4 *)(in_RDI + 0x180) = 0;
    *(undefined4 *)(in_RDI + 0x184) = 0;
    *(undefined4 *)(in_RDI + 0x188) = 0;
    *(undefined8 *)(in_RDI + 400) = 0;
    *(undefined8 *)(in_RDI + 0x158) = 0;
    *ppvVar2 = *local_c8;
    *(void **)(in_RDI + 0x158) = local_c8[1];
    *(void **)(in_RDI + 0x160) = local_c8[2];
    *(undefined4 *)(in_RDI + 0x168) = *(undefined4 *)(local_c8 + 3);
    *(void **)(in_RDI + 0x170) = local_c8[4];
    *(undefined4 *)(in_RDI + 0x178) = *(undefined4 *)(local_c8 + 5);
    *(undefined4 *)(in_RDI + 0x17c) = *(undefined4 *)((long)local_c8 + 0x2c);
    *(undefined4 *)(in_RDI + 0x180) = *(undefined4 *)(local_c8 + 6);
    *(undefined4 *)(in_RDI + 0x184) = *(undefined4 *)((long)local_c8 + 0x34);
    *(undefined4 *)(in_RDI + 0x188) = *(undefined4 *)(local_c8 + 7);
    *(void **)(in_RDI + 400) = local_c8[8];
  }
  local_110 = &local_170;
  local_b8 = ppvVar2;
  local_48 = local_110;
  if (local_168 != (int *)0x0) {
    local_4c = 0xffffffff;
    LOCK();
    local_50 = *local_168;
    *local_168 = *local_168 + -1;
    UNLOCK();
    if (local_50 == 1) {
      if (local_150 == (long *)0x0) {
        if (local_170 != (void *)0x0) {
          free(local_170);
        }
      }
      else {
        (**(code **)(*local_150 + 0x18))(local_150,local_170);
      }
    }
  }
  local_170 = (void *)0x0;
  local_160 = 0;
  local_158 = 0;
  local_148 = 0;
  local_144 = 0;
  local_140 = 0;
  local_13c = 0;
  local_138 = 0;
  local_130 = 0;
  local_168 = (int *)0x0;
  local_a8 = (long *)(in_RDI + 0x150);
  bVar3 = true;
  if (*local_a8 != 0) {
    bVar3 = *(long *)(in_RDI + 400) * (long)*(int *)(in_RDI + 0x188) == 0;
    local_10 = local_a8;
  }
  if (bVar3) {
    local_114 = -100;
  }
  else {
    if (*(int *)(in_RDI + 0xfc) != 0) {
      (**(code **)(*local_128 + 0x10))(&local_1c8,local_128,*(undefined4 *)(in_RDI + 0xd0),1);
      ppvVar2 = (void **)(in_RDI + 0x198);
      local_e8 = &local_1c8;
      local_e0 = ppvVar2;
      if (ppvVar2 != local_e8) {
        if (local_1c0 != (int *)0x0) {
          local_ec = 1;
          LOCK();
          local_f0 = *local_1c0;
          *local_1c0 = *local_1c0 + 1;
          UNLOCK();
        }
        local_88 = ppvVar2;
        if (*(long *)(in_RDI + 0x1a0) != 0) {
          piVar1 = *(int **)(in_RDI + 0x1a0);
          local_8c = 0xffffffff;
          LOCK();
          local_90 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_90 == 1) {
            if (*(long *)(in_RDI + 0x1b8) == 0) {
              local_20 = *ppvVar2;
              if (local_20 != (void *)0x0) {
                free(local_20);
              }
            }
            else {
              (**(code **)(**(long **)(in_RDI + 0x1b8) + 0x18))(*(long **)(in_RDI + 0x1b8),*ppvVar2)
              ;
            }
          }
        }
        *ppvVar2 = (void *)0x0;
        *(undefined8 *)(in_RDI + 0x1a8) = 0;
        *(undefined4 *)(in_RDI + 0x1b0) = 0;
        *(undefined4 *)(in_RDI + 0x1c0) = 0;
        *(undefined4 *)(in_RDI + 0x1c4) = 0;
        *(undefined4 *)(in_RDI + 0x1c8) = 0;
        *(undefined4 *)(in_RDI + 0x1cc) = 0;
        *(undefined4 *)(in_RDI + 0x1d0) = 0;
        *(undefined8 *)(in_RDI + 0x1d8) = 0;
        *(undefined8 *)(in_RDI + 0x1a0) = 0;
        *ppvVar2 = *local_e8;
        *(void **)(in_RDI + 0x1a0) = local_e8[1];
        *(void **)(in_RDI + 0x1a8) = local_e8[2];
        *(undefined4 *)(in_RDI + 0x1b0) = *(undefined4 *)(local_e8 + 3);
        *(void **)(in_RDI + 0x1b8) = local_e8[4];
        *(undefined4 *)(in_RDI + 0x1c0) = *(undefined4 *)(local_e8 + 5);
        *(undefined4 *)(in_RDI + 0x1c4) = *(undefined4 *)((long)local_e8 + 0x2c);
        *(undefined4 *)(in_RDI + 0x1c8) = *(undefined4 *)(local_e8 + 6);
        *(undefined4 *)(in_RDI + 0x1cc) = *(undefined4 *)((long)local_e8 + 0x34);
        *(undefined4 *)(in_RDI + 0x1d0) = *(undefined4 *)(local_e8 + 7);
        *(void **)(in_RDI + 0x1d8) = local_e8[8];
      }
      local_100 = &local_1c8;
      if (local_1c0 != (int *)0x0) {
        local_6c = 0xffffffff;
        LOCK();
        local_70 = *local_1c0;
        *local_1c0 = *local_1c0 + -1;
        UNLOCK();
        if (local_70 == 1) {
          local_d8 = ppvVar2;
          local_68 = local_100;
          if (local_1a8 == (long *)0x0) {
            if (local_1c8 != (void *)0x0) {
              free(local_1c8);
            }
          }
          else {
            (**(code **)(*local_1a8 + 0x18))(local_1a8,local_1c8);
          }
        }
      }
      bVar3 = true;
      if (*(long *)(in_RDI + 0x198) != 0) {
        bVar3 = *(long *)(in_RDI + 0x1d8) * (long)*(int *)(in_RDI + 0x1d0) == 0;
      }
      if (bVar3) {
        return -100;
      }
    }
    local_114 = 0;
  }
  return local_114;
}

Assistant:

int DeformableConv2D::load_model(const ModelBin& mb)
{
    weight_data = mb.load(weight_data_size, 0);
    if (weight_data.empty())
        return -100;

    if (bias_term)
    {
        bias_data = mb.load(num_output, 1);
        if (bias_data.empty())
            return -100;
    }
    return 0;
}